

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_183::InfoCollector::visitArrayInit<wasm::ArrayInitElem>
          (InfoCollector *this,ArrayInitElem *curr)

{
  bool bVar1;
  Field *pFVar2;
  Module *wasm;
  LocalGet *curr_00;
  ArraySet *curr_01;
  ArraySet *set;
  PossibleContents local_78;
  Module *local_58;
  LocalGet *local_50;
  LocalGet *get;
  Builder builder;
  Type valueType;
  undefined1 local_30 [8];
  optional<wasm::Field> field;
  ArrayInitElem *curr_local;
  InfoCollector *this_local;
  
  field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Field>._16_8_ = curr;
  GCTypeUtils::getField((optional<wasm::Field> *)local_30,(Type)(curr->ref->type).id,0);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_30);
  if (bVar1) {
    pFVar2 = std::optional<wasm::Field>::operator->((optional<wasm::Field> *)local_30);
    builder.wasm = (Module *)(pFVar2->type).id;
    wasm = Walker<wasm::(anonymous_namespace)::InfoCollector,_wasm::OverriddenVisitor<wasm::(anonymous_namespace)::InfoCollector,_void>_>
           ::getModule((Walker<wasm::(anonymous_namespace)::InfoCollector,_wasm::OverriddenVisitor<wasm::(anonymous_namespace)::InfoCollector,_void>_>
                        *)this);
    Builder::Builder((Builder *)&get,wasm);
    local_58 = builder.wasm;
    curr_00 = Builder::makeLocalGet((Builder *)&get,0xffffffff,(Type)builder.wasm);
    local_50 = curr_00;
    PossibleContents::many();
    addRoot(this,(Expression *)curr_00,&local_78);
    PossibleContents::~PossibleContents(&local_78);
    curr_01 = Builder::makeArraySet
                        ((Builder *)&get,
                         *(Expression **)
                          (field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Field>._16_8_ + 0x20),
                         *(Expression **)
                          (field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Field>._16_8_ + 0x28),
                         (Expression *)local_50);
    visitArraySet(this,curr_01);
  }
  return;
}

Assistant:

void visitArrayInit(ArrayInit* curr) {
    // Check for both unreachability and a bottom type. In either case we have
    // no work to do, and would error on an assertion below in finding the array
    // type.
    auto field = GCTypeUtils::getField(curr->ref->type);
    if (!field) {
      return;
    }
    // See ArrayCopy, above. Here an additional complexity is that we need to
    // model the read from the segment. As in TableGet, for now we just assume
    // any value is possible there (a root in the graph), which we set up
    // manually here as a fake unknown value, using a fake local.get that we
    // root.
    // TODO: be more precise about what is in the table
    auto valueType = field->type;
    Builder builder(*getModule());
    auto* get = builder.makeLocalGet(-1, valueType);
    addRoot(get);
    auto* set = builder.makeArraySet(curr->ref, curr->index, get);
    visitArraySet(set);
  }